

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::writeSourceInfo(XmlReporter *this,SourceLineInfo *sourceInfo)

{
  XmlWriter *this_00;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  SourceLineInfo *local_18;
  SourceLineInfo *sourceInfo_local;
  XmlReporter *this_local;
  
  local_18 = sourceInfo;
  sourceInfo_local = (SourceLineInfo *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"filename",&local_39);
  this_00 = XmlWriter::writeAttribute<char_const*>(&this->m_xml,&local_38,&local_18->file);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"line",&local_71);
  XmlWriter::writeAttribute<unsigned_long>(this_00,&local_70,&local_18->line);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void XmlReporter::writeSourceInfo( SourceLineInfo const& sourceInfo ) {
        m_xml
            .writeAttribute( "filename", sourceInfo.file )
            .writeAttribute( "line", sourceInfo.line );
    }